

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O3

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  pointer pMVar6;
  Mat *pMVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  int iVar12;
  float *pfVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  float *pfVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int k;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar16 = pMVar6->w;
  uVar2 = pMVar6->h;
  iVar20 = this->image_width;
  iVar22 = this->image_height;
  if ((iVar22 == -0xe9 && iVar20 == -0xe9) &&
      (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar6 == 0x40) {
    if (((this->max_sizes).data == (void *)0x0) ||
       ((long)(this->max_sizes).c * (this->max_sizes).cstep == 0)) {
      fVar27 = this->step_width;
      fVar1 = this->step_height;
      uVar3 = (this->min_sizes).w;
      uVar4 = (this->aspect_ratios).w;
      iVar22 = uVar3 + uVar4 + -1;
      pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar7,iVar16 * uVar2 * iVar22 * 4,4,opt->blob_allocator);
      pvVar8 = pMVar7->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar7->c * pMVar7->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar2) {
        fVar26 = 1.0 / (float)iVar16;
        uVar24 = -(uint)(fVar27 == -233.0);
        fVar27 = (float)(~uVar24 & (uint)fVar27 | uVar24 & (uint)fVar26);
        uVar24 = -(uint)(fVar1 == -233.0);
        fVar28 = (float)(int)uVar2 * 0.5;
        pfVar13 = (float *)(this->min_sizes).data;
        uVar14 = 0;
        do {
          if (0 < iVar16) {
            fVar30 = ((float)(int)uVar14 + this->offset) *
                     (float)(~uVar24 & (uint)fVar1 | (uint)(1.0 / (float)(int)uVar2) & uVar24);
            fVar31 = this->offset * fVar27;
            pfVar17 = (float *)((long)pvVar8 + (long)(iVar22 * iVar16 * 4 * (int)uVar14) * 4);
            pvVar9 = (this->min_sizes).data;
            pvVar10 = (this->aspect_ratios).data;
            iVar20 = 0;
            do {
              if (0 < (int)uVar3) {
                uVar21 = 0;
                do {
                  fVar33 = *(float *)((long)pvVar9 + uVar21 * 4);
                  fVar34 = fVar28 * fVar33 * fVar26;
                  fVar33 = fVar33 * 0.5;
                  *pfVar17 = fVar31 - fVar34;
                  pfVar17[1] = fVar30 - fVar33;
                  pfVar17[2] = fVar31 + fVar34;
                  pfVar17[3] = fVar30 + fVar33;
                  pfVar17 = pfVar17 + 4;
                  uVar21 = uVar21 + 1;
                } while (uVar3 != uVar21);
              }
              if (1 < (int)uVar4) {
                fVar33 = *pfVar13;
                uVar21 = 1;
                do {
                  fVar34 = *(float *)((long)pvVar10 + uVar21 * 4);
                  auVar38 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar34));
                  fVar32 = auVar38._0_4_;
                  fVar25 = fVar34 * fVar32 * fVar32 + -3.0;
                  fVar34 = (float)(~-(uint)(ABS(fVar34) < 1.1754944e-38) &
                                  (uint)(fVar34 * fVar32 * -0.5 * fVar25)) *
                           fVar28 * fVar33 * fVar26;
                  fVar25 = fVar32 * -0.5 * fVar33 * 0.5 * fVar25;
                  *pfVar17 = fVar31 - fVar34;
                  pfVar17[1] = fVar30 - fVar25;
                  pfVar17[2] = fVar31 + fVar34;
                  pfVar17[3] = fVar30 + fVar25;
                  pfVar17 = pfVar17 + 4;
                  uVar21 = uVar21 + 1;
                } while (uVar4 != uVar21);
              }
              fVar31 = fVar31 + fVar27;
              iVar20 = iVar20 + 1;
            } while (iVar20 != iVar16);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar2);
      }
      if (this->clip == 0) {
        return 0;
      }
      iVar16 = pMVar7->w;
      if ((long)iVar16 < 1) {
        return 0;
      }
      lVar18 = 0;
      do {
        fVar27 = *(float *)((long)pvVar8 + lVar18 * 4);
        if (fVar27 <= 0.0) {
          fVar27 = 0.0;
        }
        if (1.0 <= fVar27) {
          fVar27 = 1.0;
        }
        *(float *)((long)pvVar8 + lVar18 * 4) = fVar27;
        lVar18 = lVar18 + 1;
      } while (iVar16 != lVar18);
      return 0;
    }
  }
  else if (iVar20 != -0xe9) goto LAB_001495b7;
  iVar20 = pMVar6[1].w;
LAB_001495b7:
  if (iVar22 == -0xe9) {
    iVar22 = pMVar6[1].h;
  }
  fVar27 = this->step_width;
  fVar1 = this->step_height;
  uVar3 = (this->min_sizes).w;
  iVar5 = (this->max_sizes).w;
  uVar4 = (this->aspect_ratios).w;
  iVar19 = this->flip;
  if (this->flip != 0) {
    iVar19 = uVar4 * uVar3;
  }
  iVar19 = uVar4 * uVar3 + iVar5 + uVar3 + iVar19;
  pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar7,iVar16 * uVar2 * iVar19 * 4,2,4,opt->blob_allocator);
  pvVar8 = pMVar7->data;
  iVar12 = -100;
  if ((pvVar8 != (void *)0x0) && ((long)pMVar7->c * pMVar7->cstep != 0)) {
    if (0 < (int)uVar2) {
      fVar26 = (float)iVar20;
      fVar30 = (float)iVar22;
      auVar38._4_4_ = fVar30;
      auVar38._0_4_ = fVar26;
      auVar38._12_4_ = fVar30;
      auVar38._8_4_ = fVar26;
      uVar24 = -(uint)(fVar27 == -233.0);
      fVar27 = (float)(~uVar24 & (uint)fVar27 | (uint)(fVar26 / (float)iVar16) & uVar24);
      uVar24 = -(uint)(fVar1 == -233.0);
      uVar29 = (uint)(fVar30 / (float)(int)uVar2) & uVar24;
      auVar38 = rcpps(ZEXT416(uVar29),auVar38);
      fVar28 = auVar38._0_4_;
      fVar31 = auVar38._4_4_;
      fVar33 = auVar38._8_4_;
      fVar34 = auVar38._12_4_;
      fVar28 = (1.0 - fVar26 * fVar28) * fVar28 + fVar28;
      fVar31 = (1.0 - fVar30 * fVar31) * fVar31 + fVar31;
      fVar33 = (1.0 - fVar26 * fVar33) * fVar33 + fVar33;
      fVar34 = (1.0 - fVar30 * fVar34) * fVar34 + fVar34;
      uVar14 = 0;
      do {
        if (0 < iVar16) {
          fVar26 = ((float)(int)uVar14 + this->offset) * (float)(~uVar24 & (uint)fVar1 | uVar29);
          fVar30 = this->offset * fVar27;
          pauVar15 = (undefined1 (*) [16])
                     ((long)pvVar8 + (long)(iVar19 * iVar16 * 4 * (int)uVar14) * 4);
          pvVar9 = (this->min_sizes).data;
          iVar22 = 0;
          do {
            if (0 < (int)uVar3) {
              pvVar10 = (this->max_sizes).data;
              pvVar11 = (this->aspect_ratios).data;
              iVar20 = this->flip;
              uVar21 = 0;
              do {
                fVar25 = *(float *)((long)pvVar9 + uVar21 * 4);
                fVar32 = fVar25 * 0.5;
                auVar36._0_4_ = (fVar30 - fVar32) * fVar28;
                auVar36._4_4_ = (fVar26 - fVar32) * fVar31;
                auVar36._8_4_ = (fVar32 + fVar30) * fVar33;
                auVar36._12_4_ = (fVar32 + fVar26) * fVar34;
                *pauVar15 = auVar36;
                if (iVar5 < 1) {
                  pauVar15 = pauVar15 + 1;
                }
                else {
                  fVar25 = SQRT(fVar25 * *(float *)((long)pvVar10 + uVar21 * 4)) * 0.5;
                  *(float *)pauVar15[1] = (fVar30 - fVar25) * fVar28;
                  *(float *)(pauVar15[1] + 4) = (fVar26 - fVar25) * fVar31;
                  *(float *)(pauVar15[1] + 8) = (fVar25 + fVar30) * fVar33;
                  *(float *)(pauVar15[1] + 0xc) = (fVar25 + fVar26) * fVar34;
                  pauVar15 = pauVar15 + 2;
                }
                if (0 < (int)uVar4) {
                  uVar23 = 0;
                  do {
                    fVar25 = *(float *)((long)pvVar11 + uVar23 * 4);
                    auVar38 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar25));
                    fVar35 = auVar38._0_4_;
                    fVar37 = fVar25 * fVar35 * fVar35 + -3.0;
                    fVar25 = (float)(~-(uint)(ABS(fVar25) < 1.1754944e-38) &
                                    (uint)(fVar25 * fVar35 * -0.5 * fVar37)) * fVar32;
                    fVar37 = fVar35 * -0.5 * fVar32 * fVar37;
                    *(float *)*pauVar15 = (fVar30 - fVar25) * fVar28;
                    *(float *)((long)*pauVar15 + 4) = (fVar26 - fVar37) * fVar31;
                    *(float *)((long)*pauVar15 + 8) = (fVar30 + fVar25) * fVar33;
                    *(float *)((long)*pauVar15 + 0xc) = (fVar26 + fVar37) * fVar34;
                    if (iVar20 == 0) {
                      pauVar15 = pauVar15 + 1;
                    }
                    else {
                      *(float *)pauVar15[1] = (fVar30 - fVar37) * fVar28;
                      *(float *)(pauVar15[1] + 4) = (fVar26 - fVar25) * fVar31;
                      *(float *)(pauVar15[1] + 8) = (fVar30 + fVar37) * fVar33;
                      *(float *)(pauVar15[1] + 0xc) = (fVar26 + fVar25) * fVar34;
                      pauVar15 = pauVar15 + 2;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar4 != uVar23);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar3);
            }
            fVar30 = fVar30 + fVar27;
            iVar22 = iVar22 + 1;
          } while (iVar22 != iVar16);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar2);
    }
    uVar2 = pMVar7->w;
    if (this->clip != 0) {
      uVar14 = 0;
      if ((int)uVar2 < 1) {
        return 0;
      }
      do {
        fVar27 = *(float *)((long)pvVar8 + uVar14 * 4);
        if (fVar27 <= 0.0) {
          fVar27 = 0.0;
        }
        if (1.0 <= fVar27) {
          fVar27 = 1.0;
        }
        *(float *)((long)pvVar8 + uVar14 * 4) = fVar27;
        uVar14 = uVar14 + 1;
      } while (uVar2 != uVar14);
    }
    uVar3 = uVar2 + 3;
    if (-1 < (int)uVar2) {
      uVar3 = uVar2;
    }
    iVar12 = 0;
    if (3 < (int)uVar2) {
      iVar16 = (int)uVar3 >> 2;
      pfVar13 = (float *)((long)pvVar8 + (ulong)uVar2 * pMVar7->elemsize);
      do {
        *pfVar13 = this->variances[0];
        pfVar13[1] = this->variances[1];
        pfVar13[2] = this->variances[2];
        pfVar13[3] = this->variances[3];
        pfVar13 = pfVar13 + 4;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
  }
  return iVar12;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = sqrt(aspect_ratios[p]);
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
        step_w = (float)image_w / w;
    if (step_h == -233)
        step_h = (float)image_h / h;

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}